

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O2

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::AddInternal(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              *this,JavascriptPromise *key,int data,uint targetBucket)

{
  EntryType **ppEVar1;
  EntryType *pEVar2;
  SimpleHashEntry<Js::JavascriptPromise_*,_int> **ppSVar3;
  uint depth;
  
  pEVar2 = GetFreeEntry(this);
  pEVar2->key = key;
  pEVar2->value = data;
  ppEVar1 = this->table;
  pEVar2->next = ppEVar1[targetBucket];
  ppEVar1[targetBucket] = pEVar2;
  this->count = this->count + 1;
  depth = 0;
  for (ppSVar3 = this->table + targetBucket; *ppSVar3 != (EntryType *)0x0;
      ppSVar3 = &(*ppSVar3)->next) {
    depth = depth + 1;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,depth);
  }
  return pEVar2;
}

Assistant:

EntryType* AddInternal(TKey key, TData data, uint targetBucket)
    {
        if(resize && !disableResize && IsDenserThan<MaxAverageChainLength>())
        {
            Resize(SizePolicy::GetSize(size*2, &modFunctionIndex));
            // After resize - we will need to recalculate the bucket
            targetBucket = HashKeyToBucket(key);
        }

        EntryType* entry = GetFreeEntry();
        entry->key = key;
        entry->value = data;
        entry->next = table[targetBucket];
        table[targetBucket] = entry;
        count++;

#if PROFILE_DICTIONARY
        uint depth = 0;
        for (EntryType * current = table[targetBucket] ; current != nullptr; current = current->next)
        {
            ++depth;
        }
        if (stats)
            stats->Insert(depth);
#endif
        return entry;
    }